

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O1

void __thiscall kj::TestCase35::run(TestCase35 *this)

{
  undefined8 __s1;
  undefined8 uVar1;
  size_t sVar2;
  int iVar3;
  Foo *pFVar4;
  Baz *pBVar5;
  Qux *pQVar6;
  uint *params_2;
  uint *params_2_00;
  Foo *ptrCopy_1;
  Bar *ptrCopy;
  char *pcVar7;
  Tuple<Foo,_Bar> t;
  Tuple<Foo,_Bar,_Baz,_Qux,_Quux> t2;
  Tuple<Own<Foo>,_Own<Bar>_> t3;
  Tuple<String,_StringPtr> t5;
  Tuple<Own<Foo>,_Own<Bar>,_Own<Baz>,_Own<Qux>,_Own<Quux>_> t4;
  uint local_1ac;
  undefined8 local_1a8;
  uint local_1a0;
  uint local_19c;
  String local_198;
  long local_180;
  undefined4 local_16c;
  undefined4 local_168;
  undefined8 local_164;
  undefined4 local_15c;
  Disposer *local_158;
  Foo *local_150;
  Disposer *local_148;
  Bar *pBStack_140;
  undefined1 local_138 [20];
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  StringPtr local_118;
  StringPtr local_108;
  String local_f8;
  uint local_dc;
  String local_d8;
  StringPtr local_c0;
  StringPtr local_a8;
  StringPtr local_90;
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  local_80;
  
  local_15c = 0x28e;
  local_164 = 0x14100000315;
  local_168 = 0x1c8;
  local_16c = 0x7b;
  local_1a8 = 0x1c80000007b;
  pFVar4 = (Foo *)operator_new(4);
  pFVar4->foo = 0x7b;
  pBStack_140 = (Bar *)operator_new(4);
  pBStack_140->bar = 0x1c8;
  local_158 = (Disposer *)&_::HeapDisposer<kj::Foo>::instance;
  local_148 = (Disposer *)&_::HeapDisposer<kj::Bar>::instance;
  local_150 = pFVar4;
  if ((pBStack_140->bar != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x1c8;
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"(456u) == (get<1>(t3)->bar)\", 456u, get<1>(t3)->bar",
               (char (*) [45])"failed: expected (456u) == (get<1>(t3)->bar)",(uint *)local_138,
               (uint *)pBStack_140);
  }
  pBVar5 = (Baz *)operator_new(4);
  pBVar5->baz = 0x315;
  pQVar6 = (Qux *)operator_new(4);
  pQVar6->qux = 0x141;
  local_80.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr = (Quux *)operator_new(4);
  pFVar4 = local_150;
  (local_80.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr)->quux = 0x28e;
  local_80.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.disposer = local_158;
  local_80.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr = local_150;
  local_150 = (Foo *)0x0;
  local_80.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.disposer = local_148;
  local_80.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr = pBStack_140;
  pBStack_140 = (Bar *)0x0;
  local_80.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.disposer =
       (Disposer *)&_::HeapDisposer<kj::Baz>::instance;
  local_80.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.disposer =
       (Disposer *)&_::HeapDisposer<kj::Qux>::instance;
  local_80.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.disposer =
       (Disposer *)&_::HeapDisposer<kj::Quux>::instance;
  local_80.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.ptr = pBVar5;
  local_80.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.ptr = pQVar6;
  if ((pFVar4->foo != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x7b;
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"(123u) == (get<0>(t4)->foo)\", 123u, get<0>(t4)->foo",
               (char (*) [45])"failed: expected (123u) == (get<0>(t4)->foo)",(uint *)local_138,
               &pFVar4->foo);
  }
  if (((local_80.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar != 0x1c8) &&
     (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x1c8;
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"(456u) == (get<1>(t4)->bar)\", 456u, get<1>(t4)->bar",
               (char (*) [45])"failed: expected (456u) == (get<1>(t4)->bar)",(uint *)local_138,
               &(local_80.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar);
  }
  if (((local_80.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.ptr)->baz != 0x315) &&
     (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x315;
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x37,ERROR,
               "\"failed: expected \" \"(789u) == (get<2>(t4)->baz)\", 789u, get<2>(t4)->baz",
               (char (*) [45])"failed: expected (789u) == (get<2>(t4)->baz)",(uint *)local_138,
               &(local_80.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.ptr)->baz);
  }
  if (((local_80.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.ptr)->qux != 0x141) &&
     (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x141;
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x38,ERROR,
               "\"failed: expected \" \"(321u) == (get<3>(t4)->qux)\", 321u, get<3>(t4)->qux",
               (char (*) [45])"failed: expected (321u) == (get<3>(t4)->qux)",(uint *)local_138,
               &(local_80.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.ptr)->qux);
  }
  if (((local_80.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr)->quux != 0x28e) &&
     (_::Debug::minSeverity < 3)) {
    local_138._0_4_ = 0x28e;
    _::Debug::log<char_const(&)[46],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"(654u) == (get<4>(t4)->quux)\", 654u, get<4>(t4)->quux",
               (char (*) [46])"failed: expected (654u) == (get<4>(t4)->quux)",(uint *)local_138,
               &(local_80.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr)->quux);
  }
  heapString((String *)local_138,"foo",3);
  uVar1 = local_138._8_8_;
  __s1 = local_138._0_8_;
  local_d8.content.disposer = (ArrayDisposer *)CONCAT44(uStack_124,local_138._16_4_);
  local_c0.content.size_ = 4;
  local_c0.content.ptr = "bar";
  local_d8.content.size_ = local_138._8_8_;
  local_d8.content.ptr = (char *)local_138._0_8_;
  local_138._8_8_ = 0;
  local_138._0_8_ = (char *)0x0;
  if (((uVar1 != 4) || (iVar3 = bcmp((void *)__s1,"foo",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x3c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t5))\", \"foo\", get<0>(t5)",
               (char (*) [41])"failed: expected (\"foo\") == (get<0>(t5))",(char (*) [4])0x3a5188,
               &local_d8);
  }
  if (((local_c0.content.size_ != 4) || (iVar3 = bcmp(local_c0.content.ptr,"bar",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x3d,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t5))\", \"bar\", get<1>(t5)",
               (char (*) [41])"failed: expected (\"bar\") == (get<1>(t5))",(char (*) [4])0x3892c8,
               &local_c0);
  }
  sVar2 = local_d8.content.size_;
  pcVar7 = local_d8.content.ptr;
  local_a8.content.ptr = local_c0.content.ptr;
  local_a8.content.size_ = local_c0.content.size_;
  heapString(&local_198,"quux",4);
  local_138._8_8_ = sVar2 + (sVar2 == 0);
  if (sVar2 == 0) {
    pcVar7 = "";
  }
  local_f8.content.disposer = local_198.content.disposer;
  local_f8.content.size_ = local_198.content.size_;
  local_f8.content.ptr = local_198.content.ptr;
  local_108.content.size_ = 4;
  local_108.content.ptr = "qux";
  local_118.content.size_ = 4;
  local_118.content.ptr = "baz";
  uStack_11c = local_a8.content.size_._4_4_;
  uStack_120 = (undefined4)local_a8.content.size_;
  uStack_124 = local_a8.content.ptr._4_4_;
  local_138._16_4_ = local_a8.content.ptr._0_4_;
  local_198.content.size_ = 0;
  local_198.content.ptr = (char *)0x0;
  local_138._0_8_ = pcVar7;
  if (((local_138._8_8_ != 4) || (iVar3 = bcmp(pcVar7,"foo",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x41,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t6))\", \"foo\", get<0>(t6)",
               (char (*) [41])"failed: expected (\"foo\") == (get<0>(t6))",(char (*) [4])0x3a5188,
               (StringPtr *)local_138);
  }
  if (((CONCAT44(uStack_11c,uStack_120) != 4) ||
      (iVar3 = bcmp((void *)CONCAT44(uStack_124,local_138._16_4_),"bar",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x42,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t6))\", \"bar\", get<1>(t6)",
               (char (*) [41])"failed: expected (\"bar\") == (get<1>(t6))",(char (*) [4])0x3892c8,
               (StringPtr *)(local_138 + 0x10));
  }
  if (((local_118.content.size_ != 4) || (iVar3 = bcmp(local_118.content.ptr,"baz",3), iVar3 != 0))
     && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x43,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (get<2>(t6))\", \"baz\", get<2>(t6)",
               (char (*) [41])"failed: expected (\"baz\") == (get<2>(t6))",(char (*) [4])0x37e104,
               &local_118);
  }
  if (((local_108.content.size_ != 4) || (iVar3 = bcmp(local_108.content.ptr,"qux",3), iVar3 != 0))
     && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(\\\"qux\\\") == (get<3>(t6))\", \"qux\", get<3>(t6)",
               (char (*) [41])"failed: expected (\"qux\") == (get<3>(t6))",(char (*) [4])0x385491,
               &local_108);
  }
  if (((local_f8.content.size_ != 5) || (iVar3 = bcmp(local_f8.content.ptr,"quux",4), iVar3 != 0))
     && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42],char_const(&)[5],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x45,ERROR,
               "\"failed: expected \" \"(\\\"quux\\\") == (get<4>(t6))\", \"quux\", get<4>(t6)",
               (char (*) [42])"failed: expected (\"quux\") == (get<4>(t6))",(char (*) [5])0x389322,
               &local_f8);
  }
  params_2 = (uint *)operator_new(4);
  *params_2 = 0x7b;
  params_2_00 = (uint *)operator_new(4);
  *params_2_00 = 0x1c8;
  local_198.content.ptr = (char *)&_::HeapDisposer<kj::Foo>::instance;
  local_198.content.disposer = (ArrayDisposer *)&_::HeapDisposer<kj::Bar>::instance;
  local_198.content.size_ = 0;
  local_180 = 0;
  local_90.content.ptr = "";
  if (local_d8.content.size_ != 0) {
    local_90.content.ptr = local_d8.content.ptr;
  }
  local_90.content.size_ = local_d8.content.size_ + (local_d8.content.size_ == 0);
  local_a8.content.ptr = local_c0.content.ptr;
  local_a8.content.size_ = local_c0.content.size_;
  local_dc = (uint)local_1a8;
  local_19c = local_1a8._4_4_;
  local_1a0 = 0x315;
  if (((uint)local_1a8 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0x7b;
    _::Debug::log<char_const(&)[35],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x48,ERROR,"\"failed: expected \" \"(123u) == (a.foo)\", 123u, a.foo",
               (char (*) [35])"failed: expected (123u) == (a.foo)",&local_1ac,&local_dc);
  }
  if ((local_19c != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0x1c8;
    _::Debug::log<char_const(&)[35],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x49,ERROR,"\"failed: expected \" \"(456u) == (b.bar)\", 456u, b.bar",
               (char (*) [35])"failed: expected (456u) == (b.bar)",&local_1ac,&local_19c);
  }
  if ((*params_2 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0x7b;
    _::Debug::log<char_const(&)[36],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4a,ERROR,"\"failed: expected \" \"(123u) == (c->foo)\", 123u, c->foo",
               (char (*) [36])"failed: expected (123u) == (c->foo)",&local_1ac,params_2);
  }
  if ((*params_2_00 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0x1c8;
    _::Debug::log<char_const(&)[36],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4b,ERROR,"\"failed: expected \" \"(456u) == (d->bar)\", 456u, d->bar",
               (char (*) [36])"failed: expected (456u) == (d->bar)",&local_1ac,params_2_00);
  }
  if ((local_1a0 != 0x315) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0x315;
    _::Debug::log<char_const(&)[31],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4c,ERROR,"\"failed: expected \" \"(789u) == (e)\", 789u, e",
               (char (*) [31])"failed: expected (789u) == (e)",&local_1ac,&local_1a0);
  }
  if (((local_90.content.size_ != 4) || (iVar3 = bcmp(local_90.content.ptr,"foo",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4d,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (f)\", \"foo\", f",
               (char (*) [32])"failed: expected (\"foo\") == (f)",(char (*) [4])0x3a5188,&local_90);
  }
  if (((local_a8.content.size_ != 4) || (iVar3 = bcmp(local_a8.content.ptr,"bar",3), iVar3 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4e,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (g)\", \"bar\", g",
               (char (*) [32])"failed: expected (\"bar\") == (g)",(char (*) [4])0x3892c8,&local_a8);
  }
  operator_delete(params_2_00,4);
  operator_delete(params_2,4);
  if (local_180 != 0) {
    local_180 = 0;
    (**(local_198.content.disposer)->_vptr_ArrayDisposer)();
  }
  if (local_198.content.size_ != 0) {
    local_198.content.size_ = 0;
    (*(code *)**(undefined8 **)local_198.content.ptr)();
  }
  sVar2 = local_f8.content.size_;
  pcVar7 = local_f8.content.ptr;
  if (local_f8.content.ptr != (char *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_d8.content.size_;
  pcVar7 = local_d8.content.ptr;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  _::
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  ::~TupleImpl(&local_80);
  if (pBStack_140 != (Bar *)0x0) {
    pBStack_140 = (Bar *)0x0;
    (**local_148->_vptr_Disposer)();
  }
  if (local_150 != (Foo *)0x0) {
    local_150 = (Foo *)0x0;
    (**local_158->_vptr_Disposer)();
  }
  return;
}

Assistant:

TEST(Tuple, Tuple) {
  Tuple<Foo, Bar> t = tuple(Foo(123), Bar(456));
  EXPECT_EQ(123u, get<0>(t).foo);
  EXPECT_EQ(456u, get<1>(t).bar);

  Tuple<Foo, Bar, Baz, Qux, Quux> t2 = tuple(t, Baz(789), tuple(Qux(321), Quux(654)));
  EXPECT_EQ(123u, get<0>(t2).foo);
  EXPECT_EQ(456u, get<1>(t2).bar);
  EXPECT_EQ(789u, get<2>(t2).baz);
  EXPECT_EQ(321u, get<3>(t2).qux);
  EXPECT_EQ(654u, get<4>(t2).quux);

  Tuple<Own<Foo>, Own<Bar>> t3 = tuple(heap<Foo>(123), heap<Bar>(456));
  EXPECT_EQ(123u, get<0>(t3)->foo);
  EXPECT_EQ(456u, get<1>(t3)->bar);

  Tuple<Own<Foo>, Own<Bar>, Own<Baz>, Own<Qux>, Own<Quux>> t4 =
      tuple(mv(t3), heap<Baz>(789), tuple(heap<Qux>(321), heap<Quux>(654)));
  EXPECT_EQ(123u, get<0>(t4)->foo);
  EXPECT_EQ(456u, get<1>(t4)->bar);
  EXPECT_EQ(789u, get<2>(t4)->baz);
  EXPECT_EQ(321u, get<3>(t4)->qux);
  EXPECT_EQ(654u, get<4>(t4)->quux);

  Tuple<String, StringPtr> t5 = tuple(heapString("foo"), "bar");
  EXPECT_EQ("foo", get<0>(t5));
  EXPECT_EQ("bar", get<1>(t5));

  Tuple<StringPtr, StringPtr, StringPtr, StringPtr, String> t6 =
      tuple(Tuple<StringPtr, StringPtr>(t5), "baz", tuple("qux", heapString("quux")));
  EXPECT_EQ("foo", get<0>(t6));
  EXPECT_EQ("bar", get<1>(t6));
  EXPECT_EQ("baz", get<2>(t6));
  EXPECT_EQ("qux", get<3>(t6));
  EXPECT_EQ("quux", get<4>(t6));

  kj::apply([](Foo a, Bar b, Own<Foo> c, Own<Bar> d, uint e, StringPtr f, StringPtr g) {
    EXPECT_EQ(123u, a.foo);
    EXPECT_EQ(456u, b.bar);
    EXPECT_EQ(123u, c->foo);
    EXPECT_EQ(456u, d->bar);
    EXPECT_EQ(789u, e);
    EXPECT_EQ("foo", f);
    EXPECT_EQ("bar", g);
  }, t, tuple(heap<Foo>(123), heap<Bar>(456)), 789, mv(t5));

  uint i = tuple(123);
  EXPECT_EQ(123u, i);

  i = tuple(tuple(), 456, tuple(tuple(), tuple()));
  EXPECT_EQ(456u, i);

  EXPECT_EQ(0, (indexOfType<int, Tuple<int, char, bool>>()));
  EXPECT_EQ(1, (indexOfType<char, Tuple<int, char, bool>>()));
  EXPECT_EQ(2, (indexOfType<bool, Tuple<int, char, bool>>()));
  EXPECT_EQ(0, (indexOfType<int, int>()));
}